

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O3

void __thiscall cmFileLockPool::ScopePool::~ScopePool(ScopePool *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  std::
  for_each<std::_List_const_iterator<cmFileLock*>,ContainerAlgorithms::DefaultDeleter<std::__cxx11::list<cmFileLock*,std::allocator<cmFileLock*>>,false>>
            ((this->Locks).super__List_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
             _M_node.super__List_node_base._M_next,this);
  p_Var2 = (this->Locks).super__List_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)this) {
    p_Var1 = (((List *)&p_Var2->_M_next)->
             super__List_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

cmFileLockPool::ScopePool::~ScopePool()
{
  cmDeleteAll(this->Locks);
}